

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_interface.cpp
# Opt level: O0

bool __thiscall
cppcms::session_interface::validate_csrf_token(session_interface *this,string *token)

{
  byte bVar1;
  string session_token;
  __type local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff80;
  session_interface *in_stack_ffffffffffffff88;
  undefined1 local_51 [33];
  string local_30 [48];
  
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_51;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_51 + 1),"_csrf",(allocator *)__rhs);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff78,"",(allocator *)&stack0xffffffffffffff77);
  get(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
  std::__cxx11::string::~string((string *)(local_51 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_51);
  bVar1 = std::__cxx11::string::empty();
  local_a9 = true;
  if ((bVar1 & 1) == 0) {
    local_a9 = std::operator==(in_stack_ffffffffffffff70,__rhs);
  }
  std::__cxx11::string::~string(local_30);
  return local_a9;
}

Assistant:

bool session_interface::validate_csrf_token(std::string const &token)
{
	std::string session_token = get("_csrf","");
	return session_token.empty() || session_token == token;
}